

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void end_scope(ch_compilation *comp,uint8_t last_scope_size)

{
  undefined4 local_1c;
  undefined4 local_18;
  ch_op op_1;
  ch_op op;
  uint8_t i;
  uint8_t num_values_popped;
  uint8_t last_scope_size_local;
  ch_compilation *comp_local;
  
  if (last_scope_size != comp->scope->locals_size) {
    op_1._2_1_ = comp->scope->locals_size - last_scope_size;
    op_1._3_1_ = last_scope_size;
    _op = comp;
    for (op_1._1_1_ = OP_HALT >> 8; (byte)op_1._1_1_ < (byte)op_1._2_1_; op_1._1_1_ = op_1._1_1_ + 1
        ) {
      if ((_op->scope->locals[(int)(((uint)_op->scope->locals_size - (uint)(byte)op_1._1_1_) + -1)].
           is_captured & 1U) == 0) {
        local_1c = 1;
        ch_emit_write(&((_op->emit).emit_scope)->bytecode,&local_1c,1);
      }
      else {
        local_18 = 0x15;
        ch_emit_write(&((_op->emit).emit_scope)->bytecode,&local_18,1);
      }
    }
    _op->scope->locals_size = op_1._3_1_;
  }
  return;
}

Assistant:

void end_scope(ch_compilation *comp, uint8_t last_scope_size) {
  if (last_scope_size != comp->scope->locals_size) {
    uint8_t num_values_popped = comp->scope->locals_size - last_scope_size;

    for(uint8_t i = 0; i < num_values_popped; i++) {
      if (comp->scope->locals[comp->scope->locals_size - i - 1].is_captured) {
        EMIT_OP(GET_EMIT(comp), OP_CLOSE_UPVALUE);
      } else {
        EMIT_OP(GET_EMIT(comp), OP_POP);
      }
    }

    comp->scope->locals_size = last_scope_size;
  }
}